

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::paintEvent(QDateTimeEdit *this,QPaintEvent *event)

{
  bool bVar1;
  QDateTimeEditPrivate *this_00;
  QWidget *in_RSI;
  QDateTimeEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QStylePainter p;
  QStyleOptionComboBox optCombo;
  QStyleOptionSpinBox opt;
  ComplexControl cc;
  QDateTimeEditPrivate *this_01;
  QStyleOption *in_stack_fffffffffffffef8;
  undefined1 local_f0 [8];
  QFlagsStorage<QStyle::StateFlag> local_e8 [14];
  undefined4 local_b0;
  undefined4 local_ac;
  undefined1 local_a8;
  byte local_94;
  undefined1 local_60 [8];
  Int local_58;
  undefined4 local_20;
  undefined4 local_1c;
  byte local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QDateTimeEdit *)0x561834);
  bVar1 = QDateTimeEditPrivate::calendarPopupEnabled(this_01);
  if (bVar1) {
    memset(local_60,0xaa,0x58);
    QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)0x56187e);
    (**(code **)(*(long *)&(in_RDI->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x1c0))
              (in_RDI,local_60);
    cc = (ComplexControl)((ulong)in_RDI >> 0x20);
    memset(local_f0,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)0x5618b1);
    QStyleOption::initFrom(in_stack_fffffffffffffef8,(QWidget *)this_01);
    local_a8 = 1;
    local_94 = local_10 & 1;
    local_b0 = local_20;
    local_ac = local_1c;
    local_e8[0].i = local_58;
    if ((*(ushort *)&(this_00->super_QAbstractSpinBoxPrivate).field_0x3d0 >> 1 & 1) != 0) {
      QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)local_e8,-2);
    }
    QStylePainter::QStylePainter((QStylePainter *)this_01,in_RSI);
    QStylePainter::drawComplexControl((QStylePainter *)this_00,cc,(QStyleOptionComplex *)0x56196c);
    QStylePainter::~QStylePainter((QStylePainter *)0x561976);
    QStyleOptionComboBox::~QStyleOptionComboBox((QStyleOptionComboBox *)this_00);
    QStyleOptionSpinBox::~QStyleOptionSpinBox((QStyleOptionSpinBox *)0x56198d);
  }
  else {
    QAbstractSpinBox::paintEvent
              ((QAbstractSpinBox *)in_stack_fffffffffffffef8,(QPaintEvent *)this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::paintEvent(QPaintEvent *event)
{
    Q_D(QDateTimeEdit);
    if (!d->calendarPopupEnabled()) {
        QAbstractSpinBox::paintEvent(event);
        return;
    }

    QStyleOptionSpinBox opt;
    initStyleOption(&opt);

    QStyleOptionComboBox optCombo;

    optCombo.initFrom(this);
    optCombo.editable = true;
    optCombo.frame = opt.frame;
    optCombo.subControls = opt.subControls;
    optCombo.activeSubControls = opt.activeSubControls;
    optCombo.state = opt.state;
    if (d->readOnly) {
        optCombo.state &= ~QStyle::State_Enabled;
    }

    QStylePainter p(this);
    p.drawComplexControl(QStyle::CC_ComboBox, optCombo);
}